

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserPafTest_ParseWhole_Test::~BioparserPafTest_ParseWhole_Test
          (BioparserPafTest_ParseWhole_Test *this)

{
  BioparserPafTest::~BioparserPafTest(&this->super_BioparserPafTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserPafTest, ParseWhole) {
  Setup("sample.paf");
  o = p->Parse(-1);
  Check();
}